

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview_p.h
# Opt level: O1

void __thiscall
QAbstractItemViewPrivate::paintDropIndicator(QAbstractItemViewPrivate *this,QPainter *painter)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  QStyle *pQVar6;
  long in_FS_OFFSET;
  bool bVar7;
  int iVar9;
  undefined1 auVar8 [16];
  QStyleOption opt;
  undefined1 local_70 [8];
  undefined1 local_68 [16];
  undefined1 *local_58;
  QWidgetData *pQStack_50;
  undefined1 *local_48;
  QPalettePrivate *pQStack_40;
  undefined1 *local_38;
  QObject *pQStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = false;
  if (this->showDropIndicator == true) {
    bVar7 = false;
    if (this->state != DraggingState) goto LAB_005808dd;
    uVar1 = (this->dropIndicatorRect).x1;
    uVar3 = (this->dropIndicatorRect).y1;
    uVar2 = (this->dropIndicatorRect).x2;
    uVar4 = (this->dropIndicatorRect).y2;
    auVar8._0_4_ = -(uint)(uVar2 == uVar1 + -1);
    iVar9 = -(uint)(uVar4 == uVar3 + -1);
    auVar8._4_4_ = auVar8._0_4_;
    auVar8._8_4_ = iVar9;
    auVar8._12_4_ = iVar9;
    iVar9 = movmskpd(0,auVar8);
    if (iVar9 != 3) {
      QWidget::cursor((QWidget *)local_70);
      iVar9 = QCursor::shape();
      bVar7 = iVar9 != 0xe;
      bVar5 = true;
      goto LAB_005808dd;
    }
  }
  bVar5 = false;
  bVar7 = false;
LAB_005808dd:
  if (bVar5) {
    QCursor::~QCursor((QCursor *)local_70);
  }
  if (bVar7) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_30 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_40 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOption::QStyleOption((QStyleOption *)local_68,1,0);
    QStyleOption::initFrom
              ((QStyleOption *)local_68,
               *(QWidget **)
                &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
                 field_0x8);
    local_58._0_4_ = (this->dropIndicatorRect).x1.m_i;
    local_58._4_4_ = (this->dropIndicatorRect).y1.m_i;
    pQStack_50 = *(QWidgetData **)&(this->dropIndicatorRect).x2;
    pQVar6 = QWidget::style(*(QWidget **)
                             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                              super_QWidgetPrivate.field_0x8);
    (**(code **)(*(long *)pQVar6 + 0xb0))
              (pQVar6,0x2b,(QStyleOption *)local_68,painter,
               *(undefined8 *)
                &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
                 field_0x8);
    QStyleOption::~QStyleOption((QStyleOption *)local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void paintDropIndicator(QPainter *painter)
    {
        if (showDropIndicator && state == QAbstractItemView::DraggingState
            && !dropIndicatorRect.isNull()
#ifndef QT_NO_CURSOR
            && viewport->cursor().shape() != Qt::ForbiddenCursor
#endif
        ) {
            QStyleOption opt;
            opt.initFrom(q_func());
            opt.rect = dropIndicatorRect;
            q_func()->style()->drawPrimitive(QStyle::PE_IndicatorItemViewItemDrop, &opt, painter, q_func());
        }
    }